

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O0

void DecideOverRleUse(uint8_t *depth,size_t length,int *use_rle_for_non_zero,int *use_rle_for_zero)

{
  uint8_t uVar1;
  bool bVar2;
  ulong local_68;
  size_t k;
  size_t reps;
  ulong uStack_50;
  uint8_t value;
  size_t i;
  size_t count_reps_non_zero;
  size_t count_reps_zero;
  size_t total_reps_non_zero;
  size_t total_reps_zero;
  int *use_rle_for_zero_local;
  int *use_rle_for_non_zero_local;
  size_t length_local;
  uint8_t *depth_local;
  
  total_reps_non_zero = 0;
  count_reps_zero = 0;
  count_reps_non_zero = 1;
  i = 1;
  for (uStack_50 = 0; uStack_50 < length; uStack_50 = k + uStack_50) {
    uVar1 = depth[uStack_50];
    k = 1;
    local_68 = uStack_50;
    while( true ) {
      local_68 = local_68 + 1;
      bVar2 = false;
      if (local_68 < length) {
        bVar2 = depth[local_68] == uVar1;
      }
      if (!bVar2) break;
      k = k + 1;
    }
    if ((2 < k) && (uVar1 == '\0')) {
      total_reps_non_zero = k + total_reps_non_zero;
      count_reps_non_zero = count_reps_non_zero + 1;
    }
    if ((3 < k) && (uVar1 != '\0')) {
      count_reps_zero = k + count_reps_zero;
      i = i + 1;
    }
  }
  *use_rle_for_non_zero = (uint)(i * 2 < count_reps_zero);
  *use_rle_for_zero = (uint)(count_reps_non_zero * 2 < total_reps_non_zero);
  return;
}

Assistant:

static void DecideOverRleUse(const uint8_t* depth, const size_t length,
                             BROTLI_BOOL* use_rle_for_non_zero,
                             BROTLI_BOOL* use_rle_for_zero) {
  size_t total_reps_zero = 0;
  size_t total_reps_non_zero = 0;
  size_t count_reps_zero = 1;
  size_t count_reps_non_zero = 1;
  size_t i;
  for (i = 0; i < length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    size_t k;
    for (k = i + 1; k < length && depth[k] == value; ++k) {
      ++reps;
    }
    if (reps >= 3 && value == 0) {
      total_reps_zero += reps;
      ++count_reps_zero;
    }
    if (reps >= 4 && value != 0) {
      total_reps_non_zero += reps;
      ++count_reps_non_zero;
    }
    i += reps;
  }
  *use_rle_for_non_zero =
      TO_BROTLI_BOOL(total_reps_non_zero > count_reps_non_zero * 2);
  *use_rle_for_zero = TO_BROTLI_BOOL(total_reps_zero > count_reps_zero * 2);
}